

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::registerConnectorInterfacesToml(Federate *this,string *tomlString)

{
  pointer pbVar1;
  Core *pCVar2;
  pointer pbVar3;
  pointer pcVar4;
  size_type sVar5;
  element_type *peVar6;
  _Hash_node_base _Var7;
  _Hash_node_base *p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string_view inputType_00;
  string_view endpointType;
  string_view outputType_00;
  string_view units;
  value *v;
  undefined8 uVar17;
  undefined8 uVar18;
  _Alloc_hider _Var19;
  bool bVar20;
  bool cloning;
  bool bVar21;
  FilterTypes opType;
  int iVar22;
  TranslatorTypes ttype;
  value_type *pvVar23;
  array_type *paVar24;
  anon_class_8_1_552cbcb6 callback;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar25;
  string_type *psVar26;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar27;
  floating_type *pfVar28;
  anon_class_8_1_a8116966 callback_00;
  table_type *ptVar29;
  InvalidParameter *pIVar30;
  char *extraout_RDX;
  char *extraout_RDX_00;
  basic_value<toml::type_config> *target;
  pointer pbVar31;
  pointer pbVar32;
  __node_base *p_Var33;
  basic_value<toml::type_config> *opt;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view defVal;
  string_view defVal_00;
  format_args args;
  format_args args_00;
  string_view filterType;
  string_view translatorType;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view name;
  string_view message_06;
  string_view message_07;
  string_view fmt;
  string_view message_08;
  string_view name_00;
  string_view message_09;
  string_view message_10;
  string_view message_11;
  string_view message_12;
  string_view fmt_00;
  string_view message_13;
  string_view message_14;
  string_view message_15;
  bool defaultGlobal;
  allocator<char> local_6e9;
  _Any_data local_6e8;
  undefined1 local_6d8 [23];
  allocator<char> local_6c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  Federate *local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  value *local_678;
  string info;
  value uval;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  string inputType;
  string operation;
  string outputType;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  size_type local_2e8;
  pointer pcStack_2e0;
  size_type local_2d8;
  pointer pcStack_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  size_type local_2a8;
  pointer pcStack_2a0;
  size_type local_298;
  pointer pcStack_290;
  value doc;
  basic_value<toml::type_config> local_1c0;
  basic_value<toml::type_config> local_f8;
  
  toml::basic_value<toml::type_config>::basic_value(&doc);
  fileops::loadToml(&uval,tomlString);
  toml::basic_value<toml::type_config>::operator=(&doc,&uval);
  toml::basic_value<toml::type_config>::~basic_value(&uval);
  defaultGlobal = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uval,"defaultglobal",(allocator<char> *)&targets);
  fileops::replaceIfMember<bool>(&doc,(string *)&uval,&defaultGlobal);
  std::__cxx11::string::~string((string *)&uval);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uval,"filters",(allocator<char> *)&targets);
  bVar20 = fileops::isMember(&doc,(string *)&uval);
  std::__cxx11::string::~string((string *)&uval);
  local_6a0 = this;
  if (bVar20) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uval,"filters",(allocator<char> *)&targets);
    pvVar23 = toml::basic_value<toml::type_config>::at(&doc,(key_type *)&uval);
    std::__cxx11::string::~string((string *)&uval);
    if (pvVar23->type_ != array) {
      pIVar30 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message_04._M_str = "filters section in toml file must be an array";
      message_04._M_len = 0x2d;
      InvalidParameter::InvalidParameter(pIVar30,message_04);
      __cxa_throw(pIVar30,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar24 = toml::basic_value<toml::type_config>::as_array(pvVar23);
    pbVar1 = (paVar24->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar32 = (paVar24->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    while (pbVar32 != pbVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"name",(allocator<char> *)&targets);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = in_R9;
      fileops::getOrDefault
                (&key,(fileops *)pbVar32,&uval,(string *)0x0,(string_view)(auVar9 << 0x40));
      std::__cxx11::string::~string((string *)&uval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"cloning",(allocator<char> *)&targets);
      cloning = fileops::getOrDefault(pbVar32,(string *)&uval,false);
      std::__cxx11::string::~string((string *)&uval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"inputType",(allocator<char> *)&targets);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = in_R9;
      fileops::getOrDefault
                (&inputType,(fileops *)pbVar32,&uval,(string *)0x0,(string_view)(auVar10 << 0x40));
      std::__cxx11::string::~string((string *)&uval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"outputType",(allocator<char> *)&targets);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = in_R9;
      fileops::getOrDefault
                (&outputType,(fileops *)pbVar32,&uval,(string *)0x0,(string_view)(auVar11 << 0x40));
      std::__cxx11::string::~string((string *)&uval);
      bVar20 = outputType._M_string_length != 0;
      bVar21 = inputType._M_string_length != 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"global",(allocator<char> *)&targets);
      local_6d8[0x16] = fileops::getOrDefault(pbVar32,(string *)&uval,defaultGlobal);
      std::__cxx11::string::~string((string *)&uval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"operation",(allocator<char> *)local_6e8._M_pod_data);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targets,"custom",(allocator<char> *)&local_6c0);
      defVal._M_str = (char *)in_R9.values_;
      defVal._M_len = targets._0_8_;
      fileops::getOrDefault
                (&operation,(fileops *)pbVar32,&uval,(string *)targets.field_1.integer_.value,defVal
                );
      local_678 = pbVar32;
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&uval);
      filterType._M_str = extraout_RDX;
      filterType._M_len = (size_t)operation._M_dataplus._M_p;
      opType = filterTypeFromString((helics *)operation._M_string_length,filterType);
      bVar20 = checkValidFilterType(local_6a0,bVar20 || bVar21,opType,&operation);
      this = local_6a0;
      if (bVar20) {
        local_298 = inputType._M_string_length;
        pcStack_290 = inputType._M_dataplus._M_p;
        local_2a8 = outputType._M_string_length;
        pcStack_2a0 = outputType._M_dataplus._M_p;
        in_R9._4_4_ = 0;
        in_R9._0_4_ = opType;
        inputType_00._M_str = inputType._M_dataplus._M_p;
        inputType_00._M_len = inputType._M_string_length;
        outputType_00._M_str = outputType._M_dataplus._M_p;
        outputType_00._M_len = outputType._M_string_length;
        name._M_str = key._M_dataplus._M_p;
        name._M_len = key._M_string_length;
        callback.filter =
             generateFilter(local_6a0,(bool)local_6d8[0x16],cloning,name,opType,inputType_00,
                            outputType_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"flags",(allocator<char> *)&local_698);
        v = local_678;
        info._M_string_length = (size_type)this;
        info._M_dataplus._M_p = (pointer)callback.filter;
        toml::basic_value<toml::type_config>::basic_value(&uval);
        peVar25 = toml::find_or<toml::type_config,std::__cxx11::string>(v,&local_6c0,&uval);
        toml::basic_value<toml::type_config>::basic_value(&targets,peVar25);
        if (targets.type_ != empty) {
          if (targets.type_ == array) {
            paVar24 = toml::basic_value<toml::type_config>::as_array(&targets);
            pbVar31 = (paVar24->
                      super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar32 = (paVar24->
                           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pbVar32 != pbVar31;
                pbVar32 = pbVar32 + 1) {
              psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar32);
              loadOptions<toml::basic_value<toml::type_config>,_helics::Filter>::
              anon_class_16_2_14a9c628::operator()((anon_class_16_2_14a9c628 *)&info,psVar26);
            }
          }
          else {
            psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(&targets);
            loadOptions<toml::basic_value<toml::type_config>,_helics::Filter>::
            anon_class_16_2_14a9c628::operator()((anon_class_16_2_14a9c628 *)&info,psVar26);
          }
        }
        if (local_6c0._M_dataplus._M_p[local_6c0._M_string_length - 1] == 's') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6c0);
          local_6e8._M_unused._M_object = local_6d8;
          local_6e8._8_8_ = 0;
          local_6d8._0_8_ = local_6d8._0_8_ & 0xffffffffffffff00;
          pbVar27 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                              (v,&local_6c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_6e8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6e8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar27);
          if (local_6e8._8_8_ != 0) {
            loadOptions<toml::basic_value<toml::type_config>,_helics::Filter>::
            anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)&info,(string *)&local_6e8);
          }
          std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
        }
        toml::basic_value<toml::type_config>::~basic_value(&targets);
        toml::basic_value<toml::type_config>::~basic_value(&uval);
        std::__cxx11::string::~string((string *)&local_6c0);
        uval.type_ = empty;
        uval._1_7_ = 0;
        uval.field_1.integer_.value = 0;
        uval.field_1.integer_.format.width =
             (size_t)std::
                     _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
                     ::_M_invoke;
        uval.field_1.string_.value._M_string_length =
             (size_type)
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_manager;
        targets.type_ = empty;
        targets._1_7_ = 0;
        targets.field_1.integer_.value = 0;
        targets.field_1.integer_.format.width =
             (size_t)std::
                     _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
                     ::_M_invoke;
        local_6e8._8_8_ = 0;
        targets.field_1.string_.value._M_string_length =
             (size_type)
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_manager;
        local_6d8._8_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_invoke;
        local_6d8._0_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_manager;
        local_6e8._M_unused._0_8_ = callback.filter;
        processOptions(v,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&uval,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&targets,(function<void_(int,_int)> *)&local_6e8);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_6e8);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&targets);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&uval);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uval,"info",(allocator<char> *)&targets);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = in_R9;
        fileops::getOrDefault(&info,(fileops *)v,&uval,(string *)0x0,(string_view)(auVar12 << 0x40))
        ;
        std::__cxx11::string::~string((string *)&uval);
        if (info._M_string_length != 0) {
          pCVar2 = ((callback.filter)->super_Interface).mCore;
          (*pCVar2->_vptr_Core[0x60])
                    (pCVar2,(ulong)(uint)((callback.filter)->super_Interface).handle.hid);
        }
        uval.field_1.integer_.value = 0;
        uval.field_1.integer_.format.width =
             (size_t)std::
                     _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
                     ::_M_invoke;
        uval.field_1.string_.value._M_string_length =
             (size_type)
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_manager;
        uval._0_8_ = callback.filter;
        loadTags(v,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&uval);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&uval);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_698,"source",(allocator<char> *)&local_4b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_490,"targets",&local_6e9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_698,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_490);
        bVar20 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                           (v,(string *)&uval,(anon_class_8_1_a8116966)callback.filter);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,&local_698,&local_490);
          bVar20 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                             (v,(string *)&targets,(anon_class_8_1_a8116966)callback.filter);
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_490._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_490._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,&local_698,&local_490);
            addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                      (v,(string *)&local_6e8,(anon_class_8_1_a8116966)callback.filter);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_698,"destination",&local_6e9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b0,"targets",&local_6c1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_698,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_4b0);
        bVar20 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                           (v,(string *)&uval,(anon_class_8_1_a8116966)callback.filter);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,&local_698,&local_4b0);
          bVar20 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                             (v,(string *)&targets,(anon_class_8_1_a8116966)callback.filter);
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_4b0._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_4b0._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,&local_698,&local_4b0);
            addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                      (v,(string *)&local_6e8,(anon_class_8_1_a8116966)callback.filter);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"source",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_308,"endpoints",(allocator<char> *)&local_698);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_6c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_308);
        bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__3>
                           (v,(string *)&uval,callback);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6c0,&local_308);
          bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__3>
                             (v,(string *)&targets,callback);
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_308._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_308._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6c0,&local_308);
            addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__3>
                      (v,(string *)&local_6e8,callback);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"destination",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_328,"endpoints",(allocator<char> *)&local_698);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_6c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_328);
        bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__4>
                           (v,(string *)&uval,callback);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6c0,&local_328);
          bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__4>
                             (v,(string *)&targets,callback);
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_328._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_328._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6c0,&local_328);
            addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__4>
                      (v,(string *)&local_6e8,callback);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_6c0);
        if (cloning) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,"delivery",(allocator<char> *)&info);
          local_6c0._M_dataplus._M_p = (pointer)callback.filter;
          toml::basic_value<toml::type_config>::basic_value(&uval);
          peVar25 = toml::find_or<toml::type_config,std::__cxx11::string>(v,&local_2c8,&uval);
          toml::basic_value<toml::type_config>::basic_value(&targets,peVar25);
          if (targets.type_ != empty) {
            if (targets.type_ == array) {
              paVar24 = toml::basic_value<toml::type_config>::as_array(&targets);
              pbVar31 = (paVar24->
                        super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar32 = (paVar24->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start; pbVar32 != pbVar31;
                  pbVar32 = pbVar32 + 1) {
                psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar32);
                registerConnectorInterfacesToml::anon_class_8_1_552cbcb6::operator()
                          ((anon_class_8_1_552cbcb6 *)&local_6c0,psVar26);
              }
            }
            else {
              psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(&targets);
              registerConnectorInterfacesToml::anon_class_8_1_552cbcb6::operator()
                        ((anon_class_8_1_552cbcb6 *)&local_6c0,psVar26);
            }
          }
          if (local_2c8._M_dataplus._M_p[local_2c8._M_string_length - 1] == 's') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8
                    );
            local_6e8._M_unused._M_object = local_6d8;
            local_6e8._8_8_ = 0;
            local_6d8._0_8_ = local_6d8._0_8_ & 0xffffffffffffff00;
            pbVar27 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                                (v,&local_2c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_6e8);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_6e8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar27);
            if (local_6e8._8_8_ != 0) {
              registerConnectorInterfacesToml::anon_class_8_1_552cbcb6::operator()
                        ((anon_class_8_1_552cbcb6 *)&local_6c0,(string *)&local_6e8);
            }
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
          toml::basic_value<toml::type_config>::~basic_value(&targets);
          toml::basic_value<toml::type_config>::~basic_value(&uval);
          std::__cxx11::string::~string((string *)&local_2c8);
        }
        bVar20 = this->strictConfigChecking;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uval,"properties",(allocator<char> *)&targets);
        bVar21 = fileops::isMember(v,(string *)&uval);
        std::__cxx11::string::~string((string *)&uval);
        if (bVar21) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&uval,"properties",(allocator<char> *)&targets);
          pvVar23 = toml::basic_value<toml::type_config>::at(local_678,(key_type *)&uval);
          std::__cxx11::string::~string((string *)&uval);
          if (pvVar23->type_ == array) {
            paVar24 = toml::basic_value<toml::type_config>::as_array(pvVar23);
            pbVar31 = (paVar24->
                      super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar32 = (paVar24->
                           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pbVar32 != pbVar31;
                pbVar32 = pbVar32 + 1) {
              targets._0_8_ = (long)&targets.field_1 + 8;
              targets.field_1.integer_.value = 0;
              targets.field_1.string_.value._M_string_length =
                   targets.field_1.string_.value._M_string_length & 0xffffffffffffff00;
              pbVar27 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                                  (pbVar32,(char (*) [5])0x33c1c8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&targets);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pbVar27);
              toml::basic_value<toml::type_config>::basic_value(&uval);
              peVar25 = toml::find_or<toml::type_config,char[6]>
                                  (pbVar32,(char (*) [6])0x353fc9,&uval);
              uVar18 = targets.field_1.integer_.value;
              uVar17 = targets._0_8_;
              if (targets.field_1.integer_.value == 0) {
LAB_001990f2:
                if (bVar20 != false) {
                  message_11._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_11._M_len = 0x36;
                  logMessage(local_6a0,0,message_11);
                  pIVar30 = (InvalidParameter *)__cxa_allocate_exception(0x28);
                  message._M_str = "interface properties require \"name\" and \"value\" fields";
                  message._M_len = 0x36;
                  InvalidParameter::InvalidParameter(pIVar30,message);
                  __cxa_throw(pIVar30,&InvalidParameter::typeinfo,HelicsException::~HelicsException)
                  ;
                }
                message_06._M_str = "interface properties require \"name\" and \"value\" fields";
                message_06._M_len = 0x36;
                logMessage(local_6a0,3,message_06);
              }
              else if (peVar25->type_ == floating) {
                pfVar28 = toml::basic_value<toml::type_config>::as_floating(peVar25);
                (*((callback.filter)->super_Interface)._vptr_Interface[5])
                          (SUB84(*pfVar28,0),callback.filter,uVar18,uVar17);
              }
              else {
                if (peVar25->type_ == empty) goto LAB_001990f2;
                toml::basic_value<toml::type_config>::as_string_abi_cxx11_(peVar25);
                (*((callback.filter)->super_Interface)._vptr_Interface[6])
                          (callback.filter,uVar18,uVar17);
              }
              toml::basic_value<toml::type_config>::~basic_value(&uval);
              std::__cxx11::string::~string((string *)&targets);
              this = local_6a0;
            }
          }
          else {
            targets._0_8_ = (long)&targets.field_1 + 8;
            targets.field_1.integer_.value = 0;
            targets.field_1.string_.value._M_string_length =
                 targets.field_1.string_.value._M_string_length & 0xffffffffffffff00;
            pbVar27 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                                (pvVar23,(char (*) [5])0x33c1c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar27);
            toml::basic_value<toml::type_config>::basic_value(&uval);
            peVar25 = toml::find_or<toml::type_config,char[6]>(pvVar23,(char (*) [6])0x353fc9,&uval)
            ;
            uVar18 = targets.field_1.integer_.value;
            uVar17 = targets._0_8_;
            if (targets.field_1.integer_.value == 0) {
LAB_001991fa:
              if (bVar20 != false) {
                message_14._M_str = "interface properties require \"name\" and \"value\" fields";
                message_14._M_len = 0x36;
                logMessage(this,0,message_14);
                pIVar30 = (InvalidParameter *)__cxa_allocate_exception(0x28);
                message_02._M_str = "interface properties require \"name\" and \"value\" fields";
                message_02._M_len = 0x36;
                InvalidParameter::InvalidParameter(pIVar30,message_02);
                __cxa_throw(pIVar30,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
              }
              message_07._M_str = "interface properties require \"name\" and \"value\" fields";
              message_07._M_len = 0x36;
              logMessage(this,3,message_07);
            }
            else if (peVar25->type_ == floating) {
              pfVar28 = toml::basic_value<toml::type_config>::as_floating(peVar25);
              (*((callback.filter)->super_Interface)._vptr_Interface[5])
                        (SUB84(*pfVar28,0),callback.filter,uVar18,uVar17);
            }
            else {
              if (peVar25->type_ == empty) goto LAB_001991fa;
              toml::basic_value<toml::type_config>::as_string_abi_cxx11_(peVar25);
              (*((callback.filter)->super_Interface)._vptr_Interface[6])
                        (callback.filter,uVar18,uVar17);
            }
            toml::basic_value<toml::type_config>::~basic_value(&uval);
            std::__cxx11::string::~string((string *)&targets);
          }
        }
      }
      std::__cxx11::string::~string((string *)&operation);
      std::__cxx11::string::~string((string *)&outputType);
      std::__cxx11::string::~string((string *)&inputType);
      std::__cxx11::string::~string((string *)&key);
      pbVar32 = local_678 + 1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uval,"translators",(allocator<char> *)&targets);
  bVar20 = fileops::isMember(&doc,(string *)&uval);
  std::__cxx11::string::~string((string *)&uval);
  if (bVar20) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uval,"translators",(allocator<char> *)&targets);
    pvVar23 = toml::basic_value<toml::type_config>::at(&doc,(key_type *)&uval);
    std::__cxx11::string::~string((string *)&uval);
    if (pvVar23->type_ != array) {
      pIVar30 = (InvalidParameter *)__cxa_allocate_exception(0x28);
      message_05._M_str = "translators section in toml file must be an array";
      message_05._M_len = 0x31;
      InvalidParameter::InvalidParameter(pIVar30,message_05);
      __cxa_throw(pIVar30,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
    }
    paVar24 = toml::basic_value<toml::type_config>::as_array(pvVar23);
    pbVar1 = (paVar24->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar32 = (paVar24->
              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    while (pbVar32 != pbVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"name",(allocator<char> *)&targets);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = in_R9;
      fileops::getOrDefault
                (&key,(fileops *)pbVar32,&uval,(string *)0x0,(string_view)(auVar13 << 0x40));
      std::__cxx11::string::~string((string *)&uval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"type",(allocator<char> *)local_6e8._M_pod_data);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targets,"custom",(allocator<char> *)&local_6c0);
      defVal_00._M_str = (char *)in_R9.values_;
      defVal_00._M_len = targets._0_8_;
      fileops::getOrDefault
                (&inputType,(fileops *)pbVar32,&uval,(string *)targets.field_1.integer_.value,
                 defVal_00);
      std::__cxx11::string::~string((string *)&targets);
      std::__cxx11::string::~string((string *)&uval);
      translatorType._M_str = extraout_RDX_00;
      translatorType._M_len = (size_t)inputType._M_dataplus._M_p;
      ttype = translatorTypeFromString((helics *)inputType._M_string_length,translatorType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"endpointtype",(allocator<char> *)&targets);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = in_R9;
      fileops::getOrDefault
                (&outputType,(fileops *)pbVar32,&uval,(string *)0x0,(string_view)(auVar14 << 0x40));
      std::__cxx11::string::~string((string *)&uval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"unit",(allocator<char> *)&targets);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = in_R9;
      fileops::getOrDefault
                (&operation,(fileops *)pbVar32,&uval,(string *)0x0,(string_view)(auVar15 << 0x40));
      std::__cxx11::string::~string((string *)&uval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"units",(allocator<char> *)&targets);
      fileops::replaceIfMember(pbVar32,(string *)&uval,&operation);
      std::__cxx11::string::~string((string *)&uval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uval,"global",(allocator<char> *)&targets);
      bVar20 = fileops::getOrDefault(pbVar32,(string *)&uval,defaultGlobal);
      std::__cxx11::string::~string((string *)&uval);
      this = local_6a0;
      local_678 = pbVar32;
      if (ttype == UNRECOGNIZED) {
        if (local_6a0->strictConfigChecking == true) {
          targets._0_8_ = inputType._M_dataplus._M_p;
          targets.field_1.integer_.value = inputType._M_string_length;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)&targets;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x1f;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&uval,(v11 *)"unrecognized translator type:{}",fmt_00,args_00);
          message_13._M_str = (char *)uval._0_8_;
          message_13._M_len = uval.field_1.integer_.value;
          logMessage(local_6a0,0,message_13);
          pIVar30 = (InvalidParameter *)__cxa_allocate_exception(0x28);
          message_01._M_str = (char *)uval._0_8_;
          message_01._M_len = uval.field_1.integer_.value;
          InvalidParameter::InvalidParameter(pIVar30,message_01);
          __cxa_throw(pIVar30,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        targets._0_8_ = inputType._M_dataplus._M_p;
        targets.field_1.integer_.value = inputType._M_string_length;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&targets;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x20;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&uval,(v11 *)"unrecognized filter operation:{}",fmt,args);
        message_08._M_str = (char *)uval._0_8_;
        message_08._M_len = uval.field_1.integer_.value;
        logMessage(this,3,message_08);
        opt = &uval;
LAB_00199551:
        std::__cxx11::string::~string((string *)opt);
      }
      else {
        local_2d8 = outputType._M_string_length;
        pcStack_2d0 = outputType._M_dataplus._M_p;
        local_2e8 = operation._M_string_length;
        pcStack_2e0 = operation._M_dataplus._M_p;
        endpointType._M_str = outputType._M_dataplus._M_p;
        endpointType._M_len = outputType._M_string_length;
        units._M_str = operation._M_dataplus._M_p;
        units._M_len = operation._M_string_length;
        name_00._M_str = key._M_dataplus._M_p;
        name_00._M_len = key._M_string_length;
        callback_00.iface = generateTranslator(local_6a0,bVar20,name_00,ttype,endpointType,units);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"flags",(allocator<char> *)&local_698);
        info._M_string_length = (size_type)this;
        info._M_dataplus._M_p = (pointer)callback_00.iface;
        toml::basic_value<toml::type_config>::basic_value(&uval);
        peVar25 = toml::find_or<toml::type_config,std::__cxx11::string>(pbVar32,&local_6c0,&uval);
        toml::basic_value<toml::type_config>::basic_value(&targets,peVar25);
        if (targets.type_ != empty) {
          if (targets.type_ == array) {
            paVar24 = toml::basic_value<toml::type_config>::as_array(&targets);
            pbVar3 = (paVar24->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar31 = (paVar24->
                           super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                           )._M_impl.super__Vector_impl_data._M_start; pbVar31 != pbVar3;
                pbVar31 = pbVar31 + 1) {
              psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(pbVar31);
              loadOptions<toml::basic_value<toml::type_config>,_helics::Translator>::
              anon_class_16_2_14a9c628::operator()((anon_class_16_2_14a9c628 *)&info,psVar26);
            }
          }
          else {
            psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(&targets);
            loadOptions<toml::basic_value<toml::type_config>,_helics::Translator>::
            anon_class_16_2_14a9c628::operator()((anon_class_16_2_14a9c628 *)&info,psVar26);
          }
        }
        if (local_6c0._M_dataplus._M_p[local_6c0._M_string_length - 1] == 's') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6c0);
          local_6e8._M_unused._M_object = local_6d8;
          local_6e8._8_8_ = 0;
          local_6d8._0_8_ = local_6d8._0_8_ & 0xffffffffffffff00;
          pbVar27 = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                              (pbVar32,&local_6c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_6e8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6e8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar27);
          if (local_6e8._8_8_ != 0) {
            loadOptions<toml::basic_value<toml::type_config>,_helics::Translator>::
            anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)&info,(string *)&local_6e8);
          }
          std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
        }
        toml::basic_value<toml::type_config>::~basic_value(&targets);
        toml::basic_value<toml::type_config>::~basic_value(&uval);
        std::__cxx11::string::~string((string *)&local_6c0);
        uval.type_ = empty;
        uval._1_7_ = 0;
        uval.field_1.integer_.value = 0;
        uval.field_1.integer_.format.width =
             (size_t)std::
                     _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
                     ::_M_invoke;
        uval.field_1.string_.value._M_string_length =
             (size_type)
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_manager;
        targets.type_ = empty;
        targets._1_7_ = 0;
        targets.field_1.integer_.value = 0;
        targets.field_1.integer_.format.width =
             (size_t)std::
                     _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
                     ::_M_invoke;
        local_6e8._8_8_ = 0;
        targets.field_1.string_.value._M_string_length =
             (size_type)
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_manager;
        local_6d8._8_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_invoke;
        local_6d8._0_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_manager;
        local_6e8._M_unused._0_8_ = callback_00.iface;
        processOptions(pbVar32,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                *)&uval,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&targets,(function<void_(int,_int)> *)&local_6e8);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_6e8);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&targets);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&uval);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uval,"info",(allocator<char> *)&targets);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = in_R9;
        fileops::getOrDefault
                  (&info,(fileops *)pbVar32,&uval,(string *)0x0,(string_view)(auVar16 << 0x40));
        std::__cxx11::string::~string((string *)&uval);
        if (info._M_string_length != 0) {
          pCVar2 = ((callback_00.iface)->super_Interface).mCore;
          (*pCVar2->_vptr_Core[0x60])
                    (pCVar2,(ulong)(uint)((callback_00.iface)->super_Interface).handle.hid);
        }
        uval.field_1.integer_.value = 0;
        uval.field_1.integer_.format.width =
             (size_t)std::
                     _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
                     ::_M_invoke;
        uval.field_1.string_.value._M_string_length =
             (size_type)
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_manager;
        uval._0_8_ = callback_00.iface;
        loadTags(pbVar32,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)&uval);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&uval);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_698,"source",(allocator<char> *)&local_4b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_490,"targets",&local_6e9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_698,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_490);
        bVar20 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                           (pbVar32,(string *)&uval,callback_00);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,&local_698,&local_490);
          bVar20 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                             (pbVar32,(string *)&targets,callback_00);
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_490._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_490._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,&local_698,&local_490);
            addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                      (pbVar32,(string *)&local_6e8,callback_00);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_698,"destination",&local_6e9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b0,"targets",&local_6c1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_698,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_4b0);
        bVar20 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                           (pbVar32,(string *)&uval,callback_00);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,&local_698,&local_4b0);
          bVar20 = addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                             (pbVar32,(string *)&targets,callback_00);
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_4b0._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_4b0._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,&local_698,&local_4b0);
            addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Translator>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                      (pbVar32,(string *)&local_6e8,callback_00);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"source",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"endpoints",(allocator<char> *)&local_698);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_6c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_348);
        bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__6>
                           (pbVar32,(string *)&uval,(anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6c0,&local_348);
          bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__6>
                             (pbVar32,(string *)&targets,(anon_class_8_1_36d583d8)callback_00.iface)
          ;
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_348._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_348._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6c0,&local_348);
            addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__6>
                      (pbVar32,(string *)&local_6e8,(anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"destination",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_368,"endpoints",(allocator<char> *)&local_698);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_6c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_368);
        bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__7>
                           (pbVar32,(string *)&uval,(anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6c0,&local_368);
          bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__7>
                             (pbVar32,(string *)&targets,(anon_class_8_1_36d583d8)callback_00.iface)
          ;
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_368._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_368._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6c0,&local_368);
            addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__7>
                      (pbVar32,(string *)&local_6e8,(anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"source",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_388,"publications",(allocator<char> *)&local_698);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_6c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_388);
        bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
                           (pbVar32,(string *)&uval,(anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6c0,&local_388);
          bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
                             (pbVar32,(string *)&targets,(anon_class_8_1_36d583d8)callback_00.iface)
          ;
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_388._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_388._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6c0,&local_388);
            addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__8>
                      (pbVar32,(string *)&local_6e8,(anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"destination",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"inputs",(allocator<char> *)&local_698);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_6c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_3a8);
        bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__9>
                           (pbVar32,(string *)&uval,(anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6c0,&local_3a8);
          bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__9>
                             (pbVar32,(string *)&targets,(anon_class_8_1_36d583d8)callback_00.iface)
          ;
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_3a8._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_3a8._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6c0,&local_3a8);
            addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__9>
                      (pbVar32,(string *)&local_6e8,(anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"source",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"filters",(allocator<char> *)&local_698);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_6c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_3c8);
        bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__10>
                           (pbVar32,(string *)&uval,(anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6c0,&local_3c8);
          bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__10>
                             (pbVar32,(string *)&targets,(anon_class_8_1_36d583d8)callback_00.iface)
          ;
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_3c8._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_3c8._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6c0,&local_3c8);
            addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__10>
                      (pbVar32,(string *)&local_6e8,(anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6c0,"destination",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e8,"filters",(allocator<char> *)&local_698);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_6c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uval,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,&local_3e8);
        bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                           (pbVar32,(string *)&uval,(anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&uval);
        std::__cxx11::string::~string((string *)&targets);
        if (!bVar20) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targets,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_6c0,&local_3e8);
          bVar20 = addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                             (pbVar32,(string *)&targets,(anon_class_8_1_36d583d8)callback_00.iface)
          ;
          std::__cxx11::string::~string((string *)&targets);
          _Var19._M_p = local_3e8._M_dataplus._M_p;
          if (!bVar20) {
            iVar22 = toupper((int)*local_3e8._M_dataplus._M_p);
            *_Var19._M_p = (char)iVar22;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6c0,&local_3e8);
            addTargets<helics::Federate::registerConnectorInterfacesToml(std::__cxx11::string_const&)::__11>
                      (pbVar32,(string *)&local_6e8,(anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_6e8._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_6c0);
        bVar20 = this->strictConfigChecking;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uval,"properties",(allocator<char> *)&targets);
        bVar21 = fileops::isMember(pbVar32,(string *)&uval);
        std::__cxx11::string::~string((string *)&uval);
        if (bVar21) {
          opt = &targets;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&uval,"properties",(allocator<char> *)opt);
          pvVar23 = toml::basic_value<toml::type_config>::at(local_678,(key_type *)&uval);
          std::__cxx11::string::~string((string *)&uval);
          if (pvVar23->type_ != array) {
            targets._0_8_ = (long)&targets.field_1 + 8;
            targets.field_1.integer_.value = 0;
            targets.field_1.string_.value._M_string_length =
                 targets.field_1.string_.value._M_string_length & 0xffffffffffffff00;
            pbVar27 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                                (pvVar23,(char (*) [5])0x33c1c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)opt);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)opt,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar27);
            toml::basic_value<toml::type_config>::basic_value(&uval);
            peVar25 = toml::find_or<toml::type_config,char[6]>(pvVar23,(char (*) [6])0x353fc9,&uval)
            ;
            uVar18 = targets.field_1.integer_.value;
            uVar17 = targets._0_8_;
            if (targets.field_1.integer_.value == 0) {
LAB_0019a35c:
              if (bVar20 != false) {
                message_15._M_str = "interface properties require \"name\" and \"value\" fields";
                message_15._M_len = 0x36;
                logMessage(this,0,message_15);
                pIVar30 = (InvalidParameter *)__cxa_allocate_exception(0x28);
                message_03._M_str = "interface properties require \"name\" and \"value\" fields";
                message_03._M_len = 0x36;
                InvalidParameter::InvalidParameter(pIVar30,message_03);
                __cxa_throw(pIVar30,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
              }
              message_10._M_str = "interface properties require \"name\" and \"value\" fields";
              message_10._M_len = 0x36;
              logMessage(this,3,message_10);
            }
            else if (peVar25->type_ == floating) {
              pfVar28 = toml::basic_value<toml::type_config>::as_floating(peVar25);
              (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                        (SUB84(*pfVar28,0),callback_00.iface,uVar18,uVar17);
            }
            else {
              if (peVar25->type_ == empty) goto LAB_0019a35c;
              toml::basic_value<toml::type_config>::as_string_abi_cxx11_(peVar25);
              (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                        (callback_00.iface,uVar18,uVar17);
            }
            toml::basic_value<toml::type_config>::~basic_value(&uval);
            goto LAB_00199551;
          }
          paVar24 = toml::basic_value<toml::type_config>::as_array(pvVar23);
          pbVar31 = (paVar24->
                    super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar32 = (paVar24->
                         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar32 != pbVar31;
              pbVar32 = pbVar32 + 1) {
            targets._0_8_ = (long)&targets.field_1 + 8;
            targets.field_1.integer_.value = 0;
            targets.field_1.string_.value._M_string_length =
                 targets.field_1.string_.value._M_string_length & 0xffffffffffffff00;
            pbVar27 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                                (pbVar32,(char (*) [5])0x33c1c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar27);
            toml::basic_value<toml::type_config>::basic_value(&uval);
            peVar25 = toml::find_or<toml::type_config,char[6]>(pbVar32,(char (*) [6])0x353fc9,&uval)
            ;
            uVar18 = targets.field_1.integer_.value;
            uVar17 = targets._0_8_;
            if (targets.field_1.integer_.value == 0) {
LAB_0019a20e:
              if (bVar20 != false) {
                message_12._M_str = "interface properties require \"name\" and \"value\" fields";
                message_12._M_len = 0x36;
                logMessage(this,0,message_12);
                pIVar30 = (InvalidParameter *)__cxa_allocate_exception(0x28);
                message_00._M_str = "interface properties require \"name\" and \"value\" fields";
                message_00._M_len = 0x36;
                InvalidParameter::InvalidParameter(pIVar30,message_00);
                __cxa_throw(pIVar30,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
              }
              message_09._M_str = "interface properties require \"name\" and \"value\" fields";
              message_09._M_len = 0x36;
              logMessage(this,3,message_09);
            }
            else if (peVar25->type_ == floating) {
              pfVar28 = toml::basic_value<toml::type_config>::as_floating(peVar25);
              (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                        (SUB84(*pfVar28,0),callback_00.iface,uVar18,uVar17);
            }
            else {
              if (peVar25->type_ == empty) goto LAB_0019a20e;
              toml::basic_value<toml::type_config>::as_string_abi_cxx11_(peVar25);
              (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                        (callback_00.iface,uVar18,uVar17);
            }
            toml::basic_value<toml::type_config>::~basic_value(&uval);
            std::__cxx11::string::~string((string *)&targets);
            this = local_6a0;
          }
        }
      }
      std::__cxx11::string::~string((string *)&operation);
      std::__cxx11::string::~string((string *)&outputType);
      std::__cxx11::string::~string((string *)&inputType);
      std::__cxx11::string::~string((string *)&key);
      pbVar32 = local_678 + 1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uval,"globals",(allocator<char> *)&targets);
  bVar20 = fileops::isMember(&doc,(string *)&uval);
  std::__cxx11::string::~string((string *)&uval);
  if (bVar20) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uval,"globals",(allocator<char> *)&targets);
    pvVar23 = toml::basic_value<toml::type_config>::at(&doc,(key_type *)&uval);
    std::__cxx11::string::~string((string *)&uval);
    if (pvVar23->type_ == array) {
      paVar24 = toml::basic_value<toml::type_config>::as_array(pvVar23);
      pbVar1 = (paVar24->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar32 = (paVar24->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pbVar32 != pbVar1;
          pbVar32 = pbVar32 + 1) {
        paVar24 = toml::basic_value<toml::type_config>::as_array(pbVar32);
        psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar24->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        pcVar4 = (psVar26->_M_dataplus)._M_p;
        sVar5 = psVar26->_M_string_length;
        paVar24 = toml::basic_value<toml::type_config>::as_array(pbVar32);
        psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((paVar24->
                             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        peVar6 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar6->_vptr_Core[0x5a])
                  (peVar6,sVar5,pcVar4,psVar26->_M_string_length,(psVar26->_M_dataplus)._M_p);
      }
    }
    else {
      ptVar29 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(pvVar23);
      p_Var33 = &(ptVar29->_M_h)._M_before_begin;
      while (p_Var33 = p_Var33->_M_nxt, p_Var33 != (__node_base *)0x0) {
        _Var7._M_nxt = p_Var33[1]._M_nxt;
        p_Var8 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var33 + 2))->_M_max_load_factor;
        psVar26 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                            ((basic_value<toml::type_config> *)(p_Var33 + 5));
        peVar6 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar6->_vptr_Core[0x5a])
                  (peVar6,p_Var8,_Var7._M_nxt,psVar26->_M_string_length,(psVar26->_M_dataplus)._M_p)
        ;
      }
    }
  }
  toml::basic_value<toml::type_config>::basic_value(&local_f8,&doc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uval,"globals",(allocator<char> *)local_6e8._M_pod_data);
  targets.field_1.integer_.value = 0;
  targets.field_1.integer_.format.width =
       (size_t)std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1785:38)>
               ::_M_invoke;
  targets.field_1.string_.value._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1785:38)>
       ::_M_manager;
  targets._0_8_ = this;
  arrayPairProcess(&local_f8,(string *)&uval,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&targets);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&targets);
  std::__cxx11::string::~string((string *)&uval);
  toml::basic_value<toml::type_config>::~basic_value(&local_f8);
  toml::basic_value<toml::type_config>::basic_value(&local_1c0,&doc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uval,"aliases",(allocator<char> *)local_6e8._M_pod_data);
  targets.field_1.integer_.value = 0;
  targets.field_1.integer_.format.width =
       (size_t)std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1788:38)>
               ::_M_invoke;
  targets.field_1.string_.value._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1788:38)>
       ::_M_manager;
  targets._0_8_ = this;
  arrayPairProcess(&local_1c0,(string *)&uval,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&targets);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&targets);
  std::__cxx11::string::~string((string *)&uval);
  toml::basic_value<toml::type_config>::~basic_value(&local_1c0);
  uval.field_1.integer_.value = 0;
  uval.field_1.integer_.format.width =
       (size_t)std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1792:19)>
               ::_M_invoke;
  uval.field_1.string_.value._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1792:19)>
       ::_M_manager;
  uval._0_8_ = this;
  loadTags(&doc,(function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)&uval);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&uval);
  toml::basic_value<toml::type_config>::~basic_value(&doc);
  return;
}

Assistant:

void Federate::registerConnectorInterfacesToml(const std::string& tomlString)
{
    using fileops::getOrDefault;
    using fileops::isMember;
    using fileops::replaceIfMember;

    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    replaceIfMember(doc, "defaultglobal", defaultGlobal);

    if (isMember(doc, "filters")) {
        auto& filts = toml::find(doc, "filters");
        if (!filts.is_array()) {
            throw(helics::InvalidParameter("filters section in toml file must be an array"));
        }
        auto& filtArray = filts.as_array();
        for (const auto& filt : filtArray) {
            const std::string key = getOrDefault(filt, "name", emptyStr);
            const bool cloningflag = getOrDefault(filt, "cloning", false);
            const std::string inputType = getOrDefault(filt, "inputType", emptyStr);
            const std::string outputType = getOrDefault(filt, "outputType", emptyStr);
            const bool useTypes = !((inputType.empty()) && (outputType.empty()));
            const bool global = getOrDefault(filt, "global", defaultGlobal);
            const std::string operation = getOrDefault(filt, "operation", std::string("custom"));

            auto opType = filterTypeFromString(operation);
            if (!checkValidFilterType(useTypes, opType, operation)) {
                continue;
            }
            auto& filter =
                generateFilter(this, global, cloningflag, key, opType, inputType, outputType);

            loadOptions(this, filt, filter);
            addTargetVariations(filt, "source", "endpoints", [&filter](const std::string& target) {
                filter.addSourceTarget(target);
            });
            addTargetVariations(filt,
                                "destination",
                                "endpoints",
                                [&filter](const std::string& target) {
                                    filter.addDestinationTarget(target);
                                });
            if (cloningflag) {
                addTargets(filt, "delivery", [&filter](const std::string& target) {
                    static_cast<CloningFilter&>(filter).addDeliveryEndpoint(target);
                });
            }
            loadPropertiesToml(this, filter, filt, strictConfigChecking);
        }
    }
    if (isMember(doc, "translators")) {
        auto& transs = toml::find(doc, "translators");
        if (!transs.is_array()) {
            throw(helics::InvalidParameter("translators section in toml file must be an array"));
        }
        auto& transArray = transs.as_array();
        for (const auto& trans : transArray) {
            const std::string key = getOrDefault(trans, "name", emptyStr);

            std::string ttype = getOrDefault(trans, "type", std::string("custom"));
            auto opType = translatorTypeFromString(ttype);
            auto etype = fileops::getOrDefault(trans, "endpointtype", emptyStr);
            auto units = fileops::getOrDefault(trans, "unit", emptyStr);
            fileops::replaceIfMember(trans, "units", units);
            const bool global = fileops::getOrDefault(trans, "global", defaultGlobal);

            if (opType == TranslatorTypes::UNRECOGNIZED) {
                if (strictConfigChecking) {
                    const std::string emessage =
                        fmt::format("unrecognized translator type:{}", ttype);
                    logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                    throw(InvalidParameter(emessage));
                }
                logMessage(HELICS_LOG_LEVEL_WARNING,
                           fmt::format("unrecognized filter operation:{}", ttype));
                continue;
            }
            auto& translator = generateTranslator(this, global, key, opType, etype, units);
            loadOptions(this, trans, translator);

            addTargetVariations(trans,
                                "source",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addSourceEndpoint(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addDestinationEndpoint(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "publications",
                                [&translator](const std::string& target) {
                                    translator.addPublication(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "inputs",
                                [&translator](const std::string& target) {
                                    translator.addInputTarget(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addSourceFilter(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addDestinationFilter(target);
                                });
            loadPropertiesToml(this, translator, trans, strictConfigChecking);
        }
    }
    if (isMember(doc, "globals")) {
        auto& globals = toml::find(doc, "globals");
        if (globals.is_array()) {
            for (auto& val : globals.as_array()) {
                setGlobal(static_cast<std::string_view>(val.as_array()[0].as_string()),
                          static_cast<std::string_view>(val.as_array()[1].as_string()));
            }
        } else {
            for (const auto& val : globals.as_table()) {
                setGlobal(val.first, static_cast<std::string_view>(val.second.as_string()));
            }
        }
    }

    arrayPairProcess(doc, "globals", [this](std::string_view key, std::string_view val) {
        setGlobal(key, val);
    });
    arrayPairProcess(doc, "aliases", [this](std::string_view key, std::string_view val) {
        addAlias(key, val);
    });

    loadTags(doc, [this](std::string_view tagname, std::string_view tagvalue) {
        this->setTag(tagname, tagvalue);
    });
}